

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  bbox2d bbox;
  c_polygon poly;
  min_area_bbox p1;
  obb bbox_WXH;
  obb min_peri_bbox;
  obb min_area_bbox;
  contained_bbox p3;
  min_perimeter_bbox p2;
  bbox2d local_2e0;
  string local_2c8;
  string local_2a8;
  string local_288;
  c_polygon local_268;
  bbox2d_problem local_1f8;
  undefined4 local_1a8;
  obb local_1a0;
  obb local_158;
  obb local_110;
  contained_bbox local_c8;
  bbox2d_problem local_70;
  undefined4 local_20;
  
  if (argc == 2) {
    local_268.super_c_plylist.
    super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&local_268;
    local_268.super_c_plylist.
    super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    _M_size = 0;
    local_268.super_c_plylist.center.v[0] = 0.0;
    local_268.super_c_plylist.center.v[1] = 0.0;
    local_268.super_c_plylist.box[0] = 0.0;
    local_268.super_c_plylist.box[1] = 0.0;
    local_268.super_c_plylist.box[2]._0_2_ = 0;
    local_268.super_c_plylist.box[2]._2_6_ = 0;
    local_268.super_c_plylist.box[3]._0_2_ = 0;
    local_268.super_c_plylist._66_8_ = 0;
    local_268.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_268.area = 0.0;
    local_268.arclength = 0.0;
    local_268.super_c_plylist.
    super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         local_268.super_c_plylist.
         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    std::__cxx11::string::string((string *)&local_1f8,argv[1],(allocator *)&local_70);
    createPoly((string *)&local_1f8,&local_268);
    if (local_1f8._vptr_bbox2d_problem != (_func_int **)(local_1f8.m_solution.corners[0].v + 1)) {
      operator_delete(local_1f8._vptr_bbox2d_problem);
    }
    masc::polygon::bbox2d::bbox2d(&local_2e0,&local_268);
    local_1f8.m_solution.corners[0].v[0] = 0.0;
    local_1f8.m_solution.corners[0].v[1] = 0.0;
    local_1f8.m_solution.corners[1].v[0] = 0.0;
    local_1f8.m_solution.corners[1].v[1] = 0.0;
    local_1f8.m_solution.corners[2].v[0] = 0.0;
    local_1f8.m_solution.corners[2].v[1] = 0.0;
    local_1f8.m_solution.corners[3].v[0] = 0.0;
    local_1f8.m_solution.corners[3].v[1] = 0.0;
    local_1f8.m_solution.width = 3.4028235e+38;
    local_1f8.m_solution.height = 3.4028235e+38;
    local_1f8._vptr_bbox2d_problem = (_func_int **)&PTR_solved_00110bc0;
    local_1a8 = 0x7f7fffff;
    masc::polygon::bbox2d::build(&local_110,&local_2e0,&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BBox with min area: ",0x14);
    poVar3 = masc::polygon::operator<<((ostream *)&std::cout,&local_110);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"min_area_bbox.svg","");
    masc::polygon::saveSVG
              (&local_288,
               (c_ply *)&(((c_plylist *)
                          &(local_268.super_c_plylist.
                            super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                            super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                            ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
                         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>).
                         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                         ._M_impl._M_node._M_size,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    local_70.m_solution.corners[0].v[0] = 0.0;
    local_70.m_solution.corners[0].v[1] = 0.0;
    local_70.m_solution.corners[1].v[0] = 0.0;
    local_70.m_solution.corners[1].v[1] = 0.0;
    local_70.m_solution.corners[2].v[0] = 0.0;
    local_70.m_solution.corners[2].v[1] = 0.0;
    local_70.m_solution.corners[3].v[0] = 0.0;
    local_70.m_solution.corners[3].v[1] = 0.0;
    local_70.m_solution.width = 3.4028235e+38;
    local_70.m_solution.height = 3.4028235e+38;
    local_70._vptr_bbox2d_problem = (_func_int **)&PTR_solved_00110bf0;
    local_20 = 0x7f7fffff;
    masc::polygon::bbox2d::build(&local_158,&local_2e0,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BBox with min perimeter: ",0x19);
    poVar3 = masc::polygon::operator<<((ostream *)&std::cout,&local_158);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"min_perimeter_bbox.svg","");
    masc::polygon::saveSVG
              (&local_2a8,
               (c_ply *)&(((c_plylist *)
                          &(local_268.super_c_plylist.
                            super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                            super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                            ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
                         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>).
                         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                         ._M_impl._M_node._M_size,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    local_c8.super_bbox2d_problem.m_solution.corners[0].v[0] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[0].v[1] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[1].v[0] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[1].v[1] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[2].v[0] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[2].v[1] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[3].v[0] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.corners[3].v[1] = 0.0;
    local_c8.super_bbox2d_problem.m_solution.width = 3.4028235e+38;
    local_c8.super_bbox2d_problem.m_solution.height = 3.4028235e+38;
    local_c8.super_bbox2d_problem._vptr_bbox2d_problem = (_func_int **)&PTR_solved_00110c20;
    local_c8.m_width = 28.0;
    local_c8.m_height = 28.0;
    masc::polygon::bbox2d::build(&local_1a0,&local_2e0,&local_c8.super_bbox2d_problem);
    bVar1 = masc::polygon::contained_bbox::solved(&local_c8,&local_1a0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"BBox contained in ",0x12);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"X",1);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," square: ",9);
      poVar3 = masc::polygon::operator<<(poVar3,&local_1a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"contained_bbox.svg","");
      masc::polygon::saveSVG
                (&local_2c8,
                 (c_ply *)&(((c_plylist *)
                            &(local_268.super_c_plylist.
                              super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                              .
                              super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                              ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
                           super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>).
                           super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                           ._M_impl._M_node._M_size,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"! Error: Cannot find a bounding box that fits into ",0x33);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"X",1);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," square",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if (local_2e0.m_chull.
        super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e0.m_chull.
                      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_268.all.
        super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_268.all.
                      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::_List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::_M_clear
              ((_List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)&local_268
              );
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x112200);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," polygon",8);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv)
{
  if(argc!=2)
  {
    cerr<<"Usage: "<<argv[0]<<" polygon"<<endl;
    return 1;
  }

  //create polygon
  masc::polygon::c_polygon poly;
  createPoly(argv[1],poly);

  //create bbox of the polygon
  masc::polygon::bbox2d bbox(poly);

  //create min-area bbox
  masc::polygon::min_area_bbox p1;
  masc::polygon::obb min_area_bbox = bbox.build(p1);
  cout<<"BBox with min area: "<<min_area_bbox<<endl;
  saveSVG("min_area_bbox.svg",poly.front(),min_area_bbox);

  //build min-perimeter box
  masc::polygon::min_perimeter_bbox p2;
  masc::polygon::obb min_peri_bbox = bbox.build(p2);
  cout<<"BBox with min perimeter: "<<min_peri_bbox<<endl;
  saveSVG("min_perimeter_bbox.svg",poly.front(),min_peri_bbox);

  //build a box that fits into 13X13 square
  float W=28, H=28;
  masc::polygon::contained_bbox p3(W,H);
  masc::polygon::obb bbox_WXH = bbox.build(p3);
  if(p3.solved(bbox_WXH)==false)
    cerr<<"! Error: Cannot find a bounding box that fits into "<<W<<"X"<<H<<" square"<<endl;
  else
  {
    cout<<"BBox contained in "<<W<<"X"<<H<<" square: "<<bbox_WXH<<endl;
    saveSVG("contained_bbox.svg",poly.front(),bbox_WXH);
  }

  return 0;
}